

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

char IF97::Region3Backwards::BackwardsRegion3SubRegionDetermination(double T,double p)

{
  int iVar1;
  out_of_range *this;
  char cVar2;
  double dVar3;
  
  if (22.5 < p) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if ((p <= 22.11) || (22.5 < p)) {
    if ((p <= 22.064) || (22.11 < p)) {
      if ((Tsat97(double)::R4 == '\0') &&
         (iVar1 = __cxa_guard_acquire(&Tsat97(double)::R4), iVar1 != 0)) {
        Region4::Region4(&Tsat97::R4);
        __cxa_atexit(Region4::~Region4,&Tsat97::R4,&__dso_handle);
        __cxa_guard_release(&Tsat97(double)::R4);
      }
      dVar3 = Region4::T_p(&Tsat97::R4,p);
      if (T <= dVar3) {
        if (p <= 21.93161551) {
          return 'U';
        }
        if (p <= 22.064) {
          dVar3 = DividingLine(LINE_QU,p);
          if ((dVar3 < T) && (dVar3 = DividingLine(LINE_UV,p), T <= dVar3)) {
            return 'U';
          }
          dVar3 = DividingLine(LINE_UV,p);
          if (dVar3 < T) {
            return 'Y';
          }
          return '?';
        }
        return 'U';
      }
      if (p <= 21.90096265) {
        return 'X';
      }
      if (22.064 < p) {
        return 'X';
      }
      dVar3 = DividingLine(LINE_WX,p);
      if (T <= dVar3) {
        return 'Z';
      }
      dVar3 = DividingLine(LINE_WX,p);
      if (T <= dVar3) {
        return '?';
      }
      dVar3 = DividingLine(LINE_RX,p);
      goto joined_r0x001163d8;
    }
    dVar3 = DividingLine(LINE_QU,p);
    if ((dVar3 < T) && (dVar3 = DividingLine(LINE_UV,p), T <= dVar3)) {
      return 'U';
    }
    dVar3 = DividingLine(LINE_UV,p);
    if ((dVar3 < T) && (dVar3 = DividingLine(LINE_EF,p), T <= dVar3)) {
      return 'Y';
    }
    dVar3 = DividingLine(LINE_EF,p);
    if (dVar3 < T) {
      dVar3 = DividingLine(LINE_WX,p);
      cVar2 = 'Z';
      goto LAB_001162fa;
    }
  }
  else {
    dVar3 = DividingLine(LINE_QU,p);
    if ((dVar3 < T) && (dVar3 = DividingLine(LINE_UV,p), T <= dVar3)) {
      return 'U';
    }
    dVar3 = DividingLine(LINE_UV,p);
    if ((dVar3 < T) && (dVar3 = DividingLine(LINE_EF,p), T <= dVar3)) {
      return 'V';
    }
    dVar3 = DividingLine(LINE_EF,p);
    if (dVar3 < T) {
      dVar3 = DividingLine(LINE_WX,p);
      cVar2 = 'W';
LAB_001162fa:
      if (T <= dVar3) {
        return cVar2;
      }
    }
  }
  dVar3 = DividingLine(LINE_WX,p);
  if (T <= dVar3) {
    return '?';
  }
  dVar3 = DividingLine(LINE_RX,p);
joined_r0x001163d8:
  if (dVar3 < T) {
    return '?';
  }
  return 'X';
}

Assistant:

inline char BackwardsRegion3SubRegionDetermination(double T, double p){

            if (p > 22.5*p_fact){
               throw std::out_of_range("Out of range");
            }
            else if (22.11*p_fact < p && p <= 22.5*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'V';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'W';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (22.064*p_fact < p && p <= 22.11*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'Y';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'Z';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (T <= Tsat97(p)){
                if (21.93161551*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                    else if (DividingLine(LINE_UV, p) < T ){ return 'Y';}
                    else {return '?';}
                }
                else{
                    return 'U';
                }
            }
            else{
                if (21.90096265*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (T <= DividingLine(LINE_WX, p)){ return 'Z';}
                    else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                    else {return '?';}
                }
                else{
                    return 'X';
                }
            }
        }